

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

bool __thiscall
QCss::Parser::parse(Parser *this,StyleSheet *styleSheet,CaseSensitivity nameCaseSensitivity)

{
  QLatin1StringView str;
  bool bVar1;
  TokenType in_EDX;
  Parser *in_RSI;
  Parser *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar2;
  AnimationRule rule_3;
  PageRule rule_2;
  MediaRule rule_1;
  ImportRule rule;
  StyleRule rule_4;
  undefined4 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebc;
  undefined1 in_stack_fffffffffffffebd;
  bool bVar3;
  undefined1 uVar4;
  undefined1 in_stack_fffffffffffffebf;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  int iVar5;
  uint uVar6;
  TokenType in_stack_fffffffffffffee0;
  byte local_101;
  undefined8 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  CaseSensitivity in_stack_ffffffffffffff0c;
  StyleSheet *in_stack_ffffffffffffff10;
  undefined1 *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 local_40 [56];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QVar2 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                     (size_t)in_RDI);
  str.m_data._0_4_ = in_stack_ffffffffffffff08;
  str.m_size = in_stack_ffffffffffffff00;
  str.m_data._4_4_ = in_stack_ffffffffffffff0c;
  bVar1 = testTokenAndEndsWith
                    ((Parser *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                     (TokenType)((ulong)in_RDI >> 0x20),str);
  if (bVar1) {
    do {
      bVar1 = test((Parser *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                   (TokenType)((ulong)in_RDI >> 0x20));
      in_stack_fffffffffffffebf = true;
      if (!bVar1) {
        bVar1 = test((Parser *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                     (TokenType)((ulong)in_RDI >> 0x20));
        in_stack_fffffffffffffebf = true;
        if (!bVar1) {
          in_stack_fffffffffffffebf =
               test((Parser *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                    (TokenType)((ulong)in_RDI >> 0x20));
        }
      }
    } while ((bool)in_stack_fffffffffffffebf != false);
    bVar1 = next((Parser *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                 (TokenType)((ulong)in_RDI >> 0x20));
    if (!bVar1) {
      local_101 = 0;
      goto LAB_00a3a835;
    }
    bVar1 = next((Parser *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                 (TokenType)((ulong)in_RDI >> 0x20));
    if (!bVar1) {
      local_101 = 0;
      goto LAB_00a3a835;
    }
  }
  do {
    bVar1 = test((Parser *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                 (TokenType)((ulong)in_RDI >> 0x20));
    bVar3 = true;
    if (!bVar1) {
      bVar1 = test((Parser *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                   (TokenType)((ulong)in_RDI >> 0x20));
      bVar3 = true;
      if (!bVar1) {
        bVar3 = test((Parser *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                     (TokenType)((ulong)in_RDI >> 0x20));
      }
    }
  } while (bVar3 != false);
  uVar4 = 0;
  while (bVar1 = testImport((Parser *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8))
        , bVar1) {
    memset(&local_70,0,0x30);
    local_70 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    local_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    ImportRule::ImportRule((ImportRule *)in_RDI);
    bVar1 = parseImport((Parser *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                        (ImportRule *)in_RDI);
    if (bVar1) {
      QList<QCss::ImportRule>::append
                ((QList<QCss::ImportRule> *)in_RDI,
                 (parameter_type)
                 CONCAT17(in_stack_fffffffffffffebf,
                          CONCAT16(uVar4,CONCAT15(in_stack_fffffffffffffebd,
                                                  CONCAT14(in_stack_fffffffffffffebc,
                                                           in_stack_fffffffffffffeb8)))));
      do {
        bVar1 = test((Parser *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                     (TokenType)((ulong)in_RDI >> 0x20));
        bVar3 = true;
        if (!bVar1) {
          bVar1 = test((Parser *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                       (TokenType)((ulong)in_RDI >> 0x20));
          bVar3 = true;
          if (!bVar1) {
            bVar3 = test((Parser *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                         (TokenType)((ulong)in_RDI >> 0x20));
          }
        }
      } while (bVar3 != false);
      iVar5 = 0;
      in_stack_fffffffffffffebd = 0;
    }
    else {
      local_101 = 0;
      iVar5 = 1;
    }
    ImportRule::~ImportRule((ImportRule *)in_RDI);
    if (iVar5 != 0) goto LAB_00a3a835;
    in_stack_fffffffffffffecc = 0;
  }
  do {
    bVar1 = testMedia((Parser *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    if (bVar1) {
      memset(&local_a0,0,0x30);
      local_a0 = &DAT_aaaaaaaaaaaaaaaa;
      local_98 = &DAT_aaaaaaaaaaaaaaaa;
      local_90 = &DAT_aaaaaaaaaaaaaaaa;
      local_88 = &DAT_aaaaaaaaaaaaaaaa;
      local_80 = &DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      MediaRule::MediaRule((MediaRule *)in_RDI);
      bVar1 = parseMedia((Parser *)QVar2.m_data,(MediaRule *)QVar2.m_size);
      if (bVar1) {
        QList<QCss::MediaRule>::append
                  ((QList<QCss::MediaRule> *)in_RDI,
                   (parameter_type)
                   CONCAT17(in_stack_fffffffffffffebf,
                            CONCAT16(uVar4,CONCAT15(in_stack_fffffffffffffebd,
                                                    CONCAT14(in_stack_fffffffffffffebc,
                                                             in_stack_fffffffffffffeb8)))));
      }
      else {
        local_101 = 0;
      }
      uVar6 = (uint)!bVar1;
      MediaRule::~MediaRule((MediaRule *)in_RDI);
      if (uVar6 != 0) goto LAB_00a3a835;
      in_stack_fffffffffffffecc = 0;
    }
    else {
      bVar1 = testPage((Parser *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      if (bVar1) {
        memset(&local_d0,0,0x30);
        local_d0 = &DAT_aaaaaaaaaaaaaaaa;
        local_c8 = &DAT_aaaaaaaaaaaaaaaa;
        local_c0 = &DAT_aaaaaaaaaaaaaaaa;
        local_b8 = &DAT_aaaaaaaaaaaaaaaa;
        local_b0 = &DAT_aaaaaaaaaaaaaaaa;
        local_a8 = &DAT_aaaaaaaaaaaaaaaa;
        PageRule::PageRule((PageRule *)in_RDI);
        bVar1 = parsePage((Parser *)QVar2.m_data,(PageRule *)QVar2.m_size);
        if (bVar1) {
          QList<QCss::PageRule>::append
                    ((QList<QCss::PageRule> *)in_RDI,
                     (parameter_type)
                     CONCAT17(in_stack_fffffffffffffebf,
                              CONCAT16(uVar4,CONCAT15(in_stack_fffffffffffffebd,
                                                      CONCAT14(in_stack_fffffffffffffebc,
                                                               in_stack_fffffffffffffeb8)))));
        }
        else {
          local_101 = 0;
        }
        uVar6 = (uint)!bVar1;
        PageRule::~PageRule((PageRule *)in_RDI);
        if (uVar6 != 0) goto LAB_00a3a835;
        in_stack_fffffffffffffecc = 0;
      }
      else {
        bVar1 = testAnimation((Parser *)
                              CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
        if (bVar1) {
          memset(&stack0xffffffffffffff00,0,0x30);
          in_stack_ffffffffffffff0c = 0xaaaaaaaa;
          in_stack_ffffffffffffff10 = (StyleSheet *)&DAT_aaaaaaaaaaaaaaaa;
          AnimationRule::AnimationRule((AnimationRule *)in_RDI);
          bVar1 = parseAnimation(in_RSI,(AnimationRule *)CONCAT44(in_EDX,in_stack_fffffffffffffee0))
          ;
          if (bVar1) {
            QList<QCss::AnimationRule>::append
                      ((QList<QCss::AnimationRule> *)in_RDI,
                       (parameter_type)
                       CONCAT17(in_stack_fffffffffffffebf,
                                CONCAT16(uVar4,CONCAT15(in_stack_fffffffffffffebd,
                                                        CONCAT14(in_stack_fffffffffffffebc,
                                                                 in_stack_fffffffffffffeb8)))));
          }
          else {
            local_101 = 0;
          }
          uVar6 = (uint)!bVar1;
          AnimationRule::~AnimationRule((AnimationRule *)in_RDI);
          if (uVar6 != 0) goto LAB_00a3a835;
          in_stack_fffffffffffffecc = 0;
        }
        else {
          bVar1 = testRuleset((Parser *)0xa3a6d1);
          if (bVar1) {
            memset(local_40,0xaa,0x38);
            StyleRule::StyleRule((StyleRule *)in_RDI);
            bVar1 = parseRuleset((Parser *)CONCAT44(in_EDX,in_stack_fffffffffffffee0),
                                 (StyleRule *)QVar2.m_data);
            if (bVar1) {
              QList<QCss::StyleRule>::append
                        ((QList<QCss::StyleRule> *)in_RDI,
                         (parameter_type)
                         CONCAT17(in_stack_fffffffffffffebf,
                                  CONCAT16(uVar4,CONCAT15(in_stack_fffffffffffffebd,
                                                          CONCAT14(in_stack_fffffffffffffebc,
                                                                   in_stack_fffffffffffffeb8)))));
            }
            else {
              local_101 = 0;
            }
            uVar6 = (uint)!bVar1;
            StyleRule::~StyleRule((StyleRule *)in_RDI);
            if (uVar6 != 0) goto LAB_00a3a835;
            in_stack_fffffffffffffecc = 0;
          }
          else {
            bVar1 = test((Parser *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                         (TokenType)((ulong)in_RDI >> 0x20));
            if (bVar1) {
              bVar1 = until(in_RSI,in_EDX,in_stack_fffffffffffffee0);
              if (!bVar1) {
                local_101 = 0;
                goto LAB_00a3a835;
              }
            }
            else {
              bVar1 = hasNext(in_RDI);
              if (bVar1) {
                local_101 = 0;
                goto LAB_00a3a835;
              }
            }
          }
        }
      }
    }
    do {
      bVar1 = test((Parser *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                   (TokenType)((ulong)in_RDI >> 0x20));
      in_stack_fffffffffffffebc = true;
      if (!bVar1) {
        bVar1 = test((Parser *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                     (TokenType)((ulong)in_RDI >> 0x20));
        in_stack_fffffffffffffebc = true;
        if (!bVar1) {
          in_stack_fffffffffffffebc =
               test((Parser *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                    (TokenType)((ulong)in_RDI >> 0x20));
        }
      }
    } while ((bool)in_stack_fffffffffffffebc != false);
    bVar1 = hasNext(in_RDI);
  } while (bVar1);
  StyleSheet::buildIndexes(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  local_101 = 1;
LAB_00a3a835:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_101 & 1);
}

Assistant:

bool Parser::parse(StyleSheet *styleSheet, Qt::CaseSensitivity nameCaseSensitivity)
{
    if (testTokenAndEndsWith(ATKEYWORD_SYM, "charset"_L1)) {
        while (test(S) || test(CDO) || test(CDC)) {}
        if (!next(STRING)) return false;
        if (!next(SEMICOLON)) return false;
    }

    while (test(S) || test(CDO) || test(CDC)) {}

    while (testImport()) {
        ImportRule rule;
        if (!parseImport(&rule)) return false;
        styleSheet->importRules.append(rule);
        while (test(S) || test(CDO) || test(CDC)) {}
    }

    do {
        if (testMedia()) {
            MediaRule rule;
            if (!parseMedia(&rule)) return false;
            styleSheet->mediaRules.append(rule);
        } else if (testPage()) {
            PageRule rule;
            if (!parsePage(&rule)) return false;
            styleSheet->pageRules.append(rule);
        } else if (testAnimation()) {
            AnimationRule rule;
            if (!parseAnimation(&rule)) return false;
            styleSheet->animationRules.append(rule);
        } else if (testRuleset()) {
            StyleRule rule;
            if (!parseRuleset(&rule)) return false;
            styleSheet->styleRules.append(rule);
        } else if (test(ATKEYWORD_SYM)) {
            if (!until(RBRACE)) return false;
        } else if (hasNext()) {
            return false;
        }
        while (test(S) || test(CDO) || test(CDC)) {}
    } while (hasNext());
    styleSheet->buildIndexes(nameCaseSensitivity);
    return true;
}